

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::binary_hex_intel
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  Section *pSVar1;
  byte bVar2;
  Section *pSVar3;
  reference ppSVar4;
  uint *puVar5;
  uint uVar6;
  failure *e;
  uint local_268;
  uint8_t b;
  uint j;
  uint uStack_25c;
  uint8_t cheksum;
  uint load_address;
  uint local_254;
  uint rec_len;
  uint size;
  uint address;
  uint local_244;
  uint section_higher_address;
  uint section_lower_address;
  Section *section;
  size_t i;
  ostream local_220 [8];
  ofstream file;
  uint local_20;
  uint local_1c;
  uint higher_address_local;
  uint lower_address_local;
  uint byte_order_local;
  uint word_size_local;
  char *file_name_local;
  
  local_20 = higher_address;
  local_1c = lower_address;
  higher_address_local = byte_order;
  lower_address_local = word_size;
  _byte_order_local = file_name;
  std::ofstream::ofstream(local_220,file_name,0x10);
  for (section = (Section *)0x0; pSVar1 = section,
      pSVar3 = (Section *)
               std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                         ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table),
      pSVar1 < pSVar3; section = (Section *)&(section->name).field_0x1) {
    ppSVar4 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,
                         (size_type)section);
    _section_higher_address = *ppSVar4;
    if ((_section_higher_address->flags & 1) != 0) {
      if (local_20 < _section_higher_address->base_address) break;
      if (local_1c < _section_higher_address->base_address + _section_higher_address->content_size)
      {
        puVar5 = std::max<unsigned_int>(&local_1c,&_section_higher_address->base_address);
        local_244 = *puVar5;
        size = _section_higher_address->base_address + _section_higher_address->content_size;
        puVar5 = std::min<unsigned_int>(&local_20,&size);
        address = *puVar5;
        rec_len = local_244 + higher_address_local;
        local_254 = (address - local_244) / lower_address_local;
        do {
          uStack_25c = 0x10;
          puVar5 = std::min<unsigned_int>(&stack0xfffffffffffffda4,&local_254);
          load_address = *puVar5;
          uVar6 = rec_len / lower_address_local;
          b = (char)load_address + (char)uVar6 + (char)(uVar6 >> 8);
          ostream_printf(local_220,":%02X%04X00",(ulong)load_address,(ulong)uVar6);
          for (local_268 = 0; local_268 < load_address; local_268 = local_268 + 1) {
            bVar2 = Memory_space::read8((Memory_space *)memory,rec_len);
            ostream_printf(local_220,"%02X",(ulong)bVar2);
            b = b + bVar2;
            rec_len = lower_address_local + rec_len;
          }
          ostream_printf(local_220,"%02X\n",(ulong)(-(uint)b & 0xff));
          local_254 = local_254 - load_address;
        } while (local_254 != 0);
        local_254 = 0;
      }
    }
  }
  ostream_printf(local_220,":00000001FF\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Sections::binary_hex_intel(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (size_t i = 0; i < table.size(); ++i) {
			Section *section = table.at(i);
			if ((section->flags & Section::LOADABLE) == 0)
				continue;
			if (higher_address < section->base_address)
				break;

			if (lower_address >= section->base_address + section->content_size)
				continue;

			auto section_lower_address = max(lower_address, section->base_address);
			auto section_higher_address = min(higher_address, section->base_address + section->content_size);

			auto address = section_lower_address + byte_order;
			auto size = (section_higher_address - section_lower_address) / word_size;

			do {
				auto rec_len = min(16U, size);
				auto load_address = address / word_size;
				uint8_t cheksum = (rec_len + load_address + (load_address >> 8));
				ostream_printf(file, ":%02X%04X00", rec_len, load_address);
				for (auto j = 0U; j < rec_len; ++j, address += word_size) {
					uint8_t b = memory.read8(address);
					ostream_printf(file, "%02X", b);
					cheksum += b;
				}
				ostream_printf(file, "%02X\n", static_cast<uint8_t >(-cheksum));
				size -= rec_len;
			} while (size > 0);
		}
		ostream_printf(file, ":00000001FF\n");
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}